

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

quatd * tinyusdz::to_quaternion(quatd *__return_storage_ptr__,double3 *axis,double angle)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar2 = (angle * 0.5) / 180.0;
  dVar3 = math::sin_pi_imp<double>(dVar2);
  if (0.25 <= ABS(dVar2)) {
    dVar7 = -dVar2;
    if (-dVar2 <= dVar2) {
      dVar7 = dVar2;
    }
    dVar2 = floor(dVar7);
    dVar7 = dVar7 - dVar2;
    bVar1 = 0.5 < dVar7;
    if (0.5 < dVar7) {
      dVar7 = 1.0 - dVar7;
    }
    dVar5 = dVar7 + -0.5;
    dVar4 = 0.0;
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      dVar6 = ABS(dVar7);
      if (dVar6 <= 0.5) {
        dVar6 = 0.5;
      }
      if (dVar6 * 0.0 < ABS(dVar5)) {
        if (dVar7 <= 0.25) {
          dVar4 = cos(dVar7 * 3.141592653589793);
        }
        else {
          dVar4 = sin((0.5 - dVar7) * 3.141592653589793);
        }
        if (((bVar1 ^ (byte)(int)dVar2) & 1) != 0) {
          dVar4 = -dVar4;
        }
      }
    }
  }
  else {
    dVar4 = cos(dVar2 * 3.141592653589793);
  }
  (__return_storage_ptr__->imag)._M_elems[0] = axis->_M_elems[0] * dVar3;
  (__return_storage_ptr__->imag)._M_elems[1] = axis->_M_elems[1] * dVar3;
  (__return_storage_ptr__->imag)._M_elems[2] = dVar3 * axis->_M_elems[2];
  __return_storage_ptr__->real = dVar4;
  return __return_storage_ptr__;
}

Assistant:

value::quatd to_quaternion(const value::double3 &axis, const double angle) {

  // Use sin_pi and cos_pi for better accuracy.
  double s = math::sin_pi(angle/2.0/180.0);
  double c = math::cos_pi(angle/2.0/180.0);

  value::quatd q;
  q.imag[0] = axis[0] * s;
  q.imag[1] = axis[1] * s;
  q.imag[2] = axis[2] * s;
  q.real = c;

  return q;
}